

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int __thiscall
fmt::v7::basic_string_view<char>::compare
          (basic_string_view<char> *this,basic_string_view<char> other)

{
  ulong uVar1;
  int local_44;
  size_t local_40;
  int local_2c;
  int result;
  size_t str_size;
  basic_string_view<char> *this_local;
  basic_string_view<char> other_local;
  
  uVar1 = other.size_;
  local_40 = uVar1;
  if (this->size_ < uVar1) {
    local_40 = this->size_;
  }
  local_2c = std::char_traits<char>::compare(this->data_,other.data_,local_40);
  if (local_2c == 0) {
    if (this->size_ == uVar1) {
      local_44 = 0;
    }
    else {
      local_44 = 1;
      if (this->size_ < uVar1) {
        local_44 = -1;
      }
    }
    local_2c = local_44;
  }
  return local_2c;
}

Assistant:

int compare(basic_string_view other) const {
    size_t str_size = size_ < other.size_ ? size_ : other.size_;
    int result = std::char_traits<Char>::compare(data_, other.data_, str_size);
    if (result == 0)
      result = size_ == other.size_ ? 0 : (size_ < other.size_ ? -1 : 1);
    return result;
  }